

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.h
# Opt level: O0

uint32_t __thiscall
snestistics::EmulateRegisters::read_long
          (EmulateRegisters *this,uint32_t address,MemoryAccessType reason)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t result;
  uint32_t r;
  MemoryAccessType reason_local;
  uint32_t address_local;
  EmulateRegisters *this_local;
  
  uVar1 = remap(this,address);
  uVar2 = (uint)CONCAT12(this->_memory[uVar1 + 2],
                         CONCAT11(this->_memory[uVar1 + 1],this->_memory[uVar1]));
  if (this->_read_function != (memoryAccessFunc)0x0) {
    (*this->_read_function)(this->_callback_context,address,uVar1,uVar2,3,reason);
  }
  return uVar2;
}

Assistant:

inline uint32_t read_long(uint32_t address, MemoryAccessType reason) const {
		uint32_t r = remap(address);
		uint32_t result = _memory[r];
		result |= _memory[r + 1] << 8;
		result |= _memory[r + 2] << 16;
		if (_read_function)
			(*_read_function)(_callback_context, address, r, result, 3, reason);
		return result;
	}